

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O2

vector<Record,_std::allocator<Record>_> * __thiscall
Block::getRecord(vector<Record,_std::allocator<Record>_> *__return_storage_ptr__,Block *this,
                float key)

{
  pointer pRVar1;
  pointer pRVar2;
  undefined1 local_58 [8];
  Record record;
  
  (__return_storage_ptr__->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar1 = (this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
           super__Vector_impl_data._M_finish;
  record.numVotes = (int)key;
  for (pRVar2 = (this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar2 != pRVar1; pRVar2 = pRVar2 + 1) {
    Record::Record((Record *)local_58,pRVar2);
    if (((float)(int)record.tconst.field_2._12_4_ == (float)record.numVotes) &&
       (!NAN((float)(int)record.tconst.field_2._12_4_) && !NAN((float)record.numVotes))) {
      std::vector<Record,_std::allocator<Record>_>::push_back
                (__return_storage_ptr__,(Record *)local_58);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Record> Block::getRecord(float key) {
    std::vector<Record> recordFound;
    for (Record record : records) {
        if (record.numVotes == key) {
            recordFound.push_back(record);
            // return record;
        }
    }
    // return empty record, but should not happen
    return recordFound;
}